

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.cpp
# Opt level: O1

void update(int jobs)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 uVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  char cVar4;
  uint uVar5;
  undefined4 uVar6;
  istream *piVar7;
  long *plVar8;
  long lVar9;
  ostream *poVar10;
  mapped_type *pmVar11;
  _Base_ptr p_Var12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var13;
  _Result<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *p_Var14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var15;
  undefined8 uVar16;
  _Rb_tree_node_base *p_Var17;
  size_type *psVar18;
  pointer pfVar19;
  _State_baseV2 *__tmp;
  int iVar20;
  future<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *this;
  bool bVar21;
  string_view command;
  string_view command_00;
  string_view command_01;
  string_view command_02;
  string_view command_03;
  string_view command_04;
  mutex printer;
  vector<std::future<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::future<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  threads;
  anon_class_40_5_e12f0fb0_for__M_head_impl thread_handler;
  File_index_t index_1;
  Map symbol_map;
  atomic<int> libs;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  symbolic_links;
  ofstream db_file;
  ofstream index_file;
  Thread_safe_queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  a_file_paths;
  Thread_safe_queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  so_file_paths;
  char local_649;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_648;
  undefined8 local_628;
  undefined1 local_618 [24];
  long lStack_600;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f0;
  int local_5d0;
  undefined4 uStack_5cc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8;
  ulong local_5a8;
  undefined1 local_5a0 [8];
  undefined1 local_598 [44];
  undefined4 local_56c;
  undefined8 local_568;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_560;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_558;
  undefined1 local_528 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_520;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_518 [6];
  ios_base local_4b0 [128];
  ios_base aiStack_430 [264];
  undefined1 local_328 [8];
  size_type local_320;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318 [14];
  ios_base aiStack_230 [264];
  __native_type local_128;
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Stack_100;
  __native_type local_a8;
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Stack_80;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Generating file list\n",0x15);
  std::ostream::flush();
  _Stack_80._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  _Stack_80._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  _Stack_80._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  _Stack_80._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  _Stack_80._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  _Stack_80._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  _Stack_80._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  _Stack_80._M_impl.super__Deque_impl_data._M_map_size = 0;
  _Stack_80._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_a8.__data.__list.__next = (__pthread_internal_list *)0x0;
  _Stack_80._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_a8._16_8_ = 0;
  local_a8.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_a8.__align = 0;
  local_a8._8_8_ = 0;
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_initialize_map(&_Stack_80,0);
  _Stack_100._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  _Stack_100._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  _Stack_100._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  _Stack_100._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  _Stack_100._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  _Stack_100._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  _Stack_100._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  _Stack_100._M_impl.super__Deque_impl_data._M_map_size = 0;
  _Stack_100._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_128.__data.__list.__next = (__pthread_internal_list *)0x0;
  _Stack_100._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_128._16_8_ = 0;
  local_128.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_128.__align = 0;
  local_128._8_8_ = 0;
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_initialize_map(&_Stack_100,0);
  local_558._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_558._M_impl.super__Rb_tree_header._M_header;
  local_558._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_558._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_558._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_56c = 0;
  command._M_str = "locate -ber lib.*\\.so$";
  command._M_len = 0x16;
  local_558._M_impl.super__Rb_tree_header._M_header._M_right =
       local_558._M_impl.super__Rb_tree_header._M_header._M_left;
  get_output_from_command_abi_cxx11_((string *)local_328,command);
  std::__cxx11::istringstream::istringstream((istringstream *)local_528,(string *)local_328,_S_in);
  local_5a8 = (ulong)(uint)jobs;
  if (local_328 != (undefined1  [8])local_318) {
    operator_delete((void *)local_328,
                    CONCAT71(local_318[0]._M_allocated_capacity._1_7_,local_318[0]._M_local_buf[0])
                    + 1);
  }
  local_328 = (undefined1  [8])local_318;
  local_320 = 0;
  local_318[0]._M_local_buf[0] = '\0';
  paVar1 = &local_648.field_2;
  iVar20 = 0;
  while( true ) {
    cVar4 = std::ios::widen((char)*(undefined8 *)((long)local_528 + -0x18) +
                            (char)(istream *)local_528);
    piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_528,(string *)local_328,cVar4);
    if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) break;
    std::operator+(&local_5f0,"file \"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328);
    plVar8 = (long *)std::__cxx11::string::_M_replace_aux
                               ((ulong)&local_5f0,local_5f0._M_string_length,0,'\x01');
    psVar18 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar18) {
      local_648.field_2._M_allocated_capacity = *psVar18;
      local_648.field_2._8_8_ = plVar8[3];
      local_648._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_648.field_2._M_allocated_capacity = *psVar18;
      local_648._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_648._M_string_length = plVar8[1];
    *plVar8 = (long)psVar18;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    command_00._M_str = local_648._M_dataplus._M_p;
    command_00._M_len = local_648._M_string_length;
    get_output_from_command_abi_cxx11_((string *)local_5a0,command_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_648._M_dataplus._M_p != paVar1) {
      operator_delete(local_648._M_dataplus._M_p,local_648.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f0._M_dataplus._M_p != &local_5f0.field_2) {
      operator_delete(local_5f0._M_dataplus._M_p,local_5f0.field_2._M_allocated_capacity + 1);
    }
    lVar9 = std::__cxx11::string::find((char *)local_5a0,0x12412a,0);
    if (lVar9 == -1) {
      lVar9 = std::__cxx11::string::find((char *)local_5a0,0x124147,0);
      if (lVar9 != 0) {
        std::operator+(&local_648,'\x01',
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_328);
        std::operator+(&local_5c8,"readlink -f \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_328);
        plVar8 = (long *)std::__cxx11::string::_M_replace_aux
                                   ((ulong)&local_5c8,local_5c8._M_string_length,0,'\x01');
        local_618._0_8_ = local_618 + 0x10;
        pfVar19 = (pointer)(plVar8 + 2);
        if ((pointer)*plVar8 == pfVar19) {
          local_618._16_8_ =
               (pfVar19->
               super___basic_future<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               )._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
          lStack_600 = plVar8[3];
        }
        else {
          local_618._16_8_ =
               (pfVar19->
               super___basic_future<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               )._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
          local_618._0_8_ = (pointer)*plVar8;
        }
        local_618._8_8_ = plVar8[1];
        *plVar8 = (long)pfVar19;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        command_01._M_str = (char *)local_618._0_8_;
        command_01._M_len = local_618._8_8_;
        get_output_from_command_abi_cxx11_(&local_5f0,command_01);
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&local_558,&local_5f0);
        std::__cxx11::string::_M_append((char *)pmVar11,(ulong)local_648._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5f0._M_dataplus._M_p != &local_5f0.field_2) {
          operator_delete(local_5f0._M_dataplus._M_p,local_5f0.field_2._M_allocated_capacity + 1);
        }
        if ((pointer)local_618._0_8_ != (pointer)(local_618 + 0x10)) {
          operator_delete((void *)local_618._0_8_,(ulong)((long)(_func_int ***)local_618._16_8_ + 1)
                         );
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
          operator_delete(local_5c8._M_dataplus._M_p,local_5c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_648._M_dataplus._M_p != paVar1) {
          operator_delete(local_648._M_dataplus._M_p,local_648.field_2._M_allocated_capacity + 1);
        }
      }
    }
    else {
      std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&_Stack_80,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328);
      iVar20 = iVar20 + 1;
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar20);
      local_648._M_dataplus._M_p._0_1_ = 0xd;
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&local_648,1);
      std::ostream::flush();
    }
    if ((undefined1 *)CONCAT44(local_5a0._4_4_,local_5a0._0_4_) != local_598 + 8) {
      operator_delete((undefined1 *)CONCAT44(local_5a0._4_4_,local_5a0._0_4_),local_598._8_8_ + 1);
    }
  }
  if (local_328 != (undefined1  [8])local_318) {
    operator_delete((void *)local_328,
                    CONCAT71(local_318[0]._M_allocated_capacity._1_7_,local_318[0]._M_local_buf[0])
                    + 1);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)local_528);
  std::ios_base::~ios_base(local_4b0);
  command_02._M_str = "locate -ber lib.*\\.a$";
  command_02._M_len = 0x15;
  get_output_from_command_abi_cxx11_((string *)local_328,command_02);
  std::__cxx11::istringstream::istringstream((istringstream *)local_528,(string *)local_328,_S_in);
  if (local_328 != (undefined1  [8])local_318) {
    operator_delete((void *)local_328,
                    CONCAT71(local_318[0]._M_allocated_capacity._1_7_,local_318[0]._M_local_buf[0])
                    + 1);
  }
  local_328 = (undefined1  [8])local_318;
  local_320 = 0;
  local_318[0]._M_local_buf[0] = '\0';
  while( true ) {
    cVar4 = std::ios::widen((char)*(undefined8 *)((long)local_528 + -0x18) +
                            (char)(istream *)local_528);
    piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_528,(string *)local_328,cVar4);
    if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) break;
    std::operator+(&local_5f0,"file \"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328);
    plVar8 = (long *)std::__cxx11::string::_M_replace_aux
                               ((ulong)&local_5f0,local_5f0._M_string_length,0,'\x01');
    psVar18 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar18) {
      local_648.field_2._M_allocated_capacity = *psVar18;
      local_648.field_2._8_8_ = plVar8[3];
      local_648._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_648.field_2._M_allocated_capacity = *psVar18;
      local_648._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_648._M_string_length = plVar8[1];
    *plVar8 = (long)psVar18;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    command_03._M_str = local_648._M_dataplus._M_p;
    command_03._M_len = local_648._M_string_length;
    get_output_from_command_abi_cxx11_((string *)local_5a0,command_03);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_648._M_dataplus._M_p != paVar1) {
      operator_delete(local_648._M_dataplus._M_p,local_648.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f0._M_dataplus._M_p != &local_5f0.field_2) {
      operator_delete(local_5f0._M_dataplus._M_p,local_5f0.field_2._M_allocated_capacity + 1);
    }
    lVar9 = std::__cxx11::string::find((char *)local_5a0,0x124179,0);
    if (lVar9 == -1) {
      lVar9 = std::__cxx11::string::find((char *)local_5a0,0x124147,0);
      if (lVar9 != 0) {
        std::operator+(&local_648,'\x01',
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_328);
        std::operator+(&local_5c8,"readlink -f \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_328);
        plVar8 = (long *)std::__cxx11::string::_M_replace_aux
                                   ((ulong)&local_5c8,local_5c8._M_string_length,0,'\x01');
        local_618._0_8_ = local_618 + 0x10;
        pfVar19 = (pointer)(plVar8 + 2);
        if ((pointer)*plVar8 == pfVar19) {
          local_618._16_8_ =
               (pfVar19->
               super___basic_future<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               )._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
          lStack_600 = plVar8[3];
        }
        else {
          local_618._16_8_ =
               (pfVar19->
               super___basic_future<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               )._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
          local_618._0_8_ = (pointer)*plVar8;
        }
        local_618._8_8_ = plVar8[1];
        *plVar8 = (long)pfVar19;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        command_04._M_str = (char *)local_618._0_8_;
        command_04._M_len = local_618._8_8_;
        get_output_from_command_abi_cxx11_(&local_5f0,command_04);
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&local_558,&local_5f0);
        std::__cxx11::string::_M_append((char *)pmVar11,(ulong)local_648._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5f0._M_dataplus._M_p != &local_5f0.field_2) {
          operator_delete(local_5f0._M_dataplus._M_p,local_5f0.field_2._M_allocated_capacity + 1);
        }
        if ((pointer)local_618._0_8_ != (pointer)(local_618 + 0x10)) {
          operator_delete((void *)local_618._0_8_,(ulong)((long)(_func_int ***)local_618._16_8_ + 1)
                         );
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
          operator_delete(local_5c8._M_dataplus._M_p,local_5c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_648._M_dataplus._M_p != paVar1) {
          operator_delete(local_648._M_dataplus._M_p,local_648.field_2._M_allocated_capacity + 1);
        }
      }
    }
    else {
      std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&_Stack_100,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328);
      iVar20 = iVar20 + 1;
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar20);
      local_648._M_dataplus._M_p._0_1_ = 0xd;
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&local_648,1);
      std::ostream::flush();
    }
    if ((undefined1 *)CONCAT44(local_5a0._4_4_,local_5a0._0_4_) != local_598 + 8) {
      operator_delete((undefined1 *)CONCAT44(local_5a0._4_4_,local_5a0._0_4_),local_598._8_8_ + 1);
    }
  }
  if (local_328 != (undefined1  [8])local_318) {
    operator_delete((void *)local_328,
                    CONCAT71(local_318[0]._M_allocated_capacity._1_7_,local_318[0]._M_local_buf[0])
                    + 1);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)local_528);
  std::ios_base::~ios_base(local_4b0);
  local_528 = (undefined1  [8])local_518;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_528,data_base_path_abi_cxx11_._M_dataplus._M_p,
             data_base_path_abi_cxx11_._M_dataplus._M_p + data_base_path_abi_cxx11_._M_string_length
            );
  boost::filesystem::detail::create_directory((path *)local_528,(path *)0x0,(error_code *)0x0);
  if (local_528 != (undefined1  [8])local_518) {
    operator_delete((void *)local_528,local_518[0]._M_allocated_capacity + 1);
  }
  std::ofstream::ofstream(local_528,(string *)&symbolic_links_filepath_abi_cxx11_,_S_out|_S_bin);
  std::ofstream::ofstream
            (local_328,(string *)&symbolic_links_index_filepath_abi_cxx11_,_S_out|_S_bin);
  if ((_Rb_tree_header *)local_558._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_558._M_impl.super__Rb_tree_header) {
    p_Var12 = local_558._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_5a0._0_4_ = std::ostream::tellp();
      std::ostream::write(local_328,(long)local_5a0);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_528,*(char **)(p_Var12 + 1),(long)p_Var12[1]._M_parent);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,*(char **)(p_Var12 + 2),(long)p_Var12[2]._M_parent);
      local_648._M_dataplus._M_p = local_648._M_dataplus._M_p & 0xffffffffffffff00;
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&local_648,1);
      p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
    } while ((_Rb_tree_header *)p_Var12 != &local_558._M_impl.super__Rb_tree_header);
  }
  plVar8 = (long *)std::ostream::flush();
  if ((*(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) & 5) != 0) {
    __assert_fail("symbolic_links_file.flush()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Toeger[P]LibFinder/generate.cpp"
                  ,0x76,"void update(int)");
  }
  plVar8 = (long *)std::ostream::flush();
  uVar2 = ___throw_bad_array_new_length;
  p_Var15 = _VTT;
  if ((*(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) & 5) != 0) {
    __assert_fail("symbolic_links_index_file.flush()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Toeger[P]LibFinder/generate.cpp"
                  ,0x77,"void update(int)");
  }
  local_328 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_328 + *(long *)&_VTT[-2]._M_use_count) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf((filebuf *)&local_320);
  std::ios_base::~ios_base(aiStack_230);
  local_528 = (undefined1  [8])p_Var15;
  local_560 = p_Var15;
  local_568 = uVar2;
  *(undefined8 *)(local_528 + *(long *)&p_Var15[-2]._M_use_count) = uVar2;
  std::filebuf::~filebuf((filebuf *)&_Stack_520);
  std::ios_base::~ios_base(aiStack_430);
  iVar20 = Thread_safe_queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::size((Thread_safe_queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_a8.__data);
  local_5d0 = Thread_safe_queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::size((Thread_safe_queue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_128.__data);
  local_5d0 = local_5d0 + iVar20;
  local_618._0_8_ =
       (future<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        *)0x0;
  local_618._8_8_ =
       (future<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        *)0x0;
  local_618._16_8_ = (pointer)0x0;
  local_628 = 0;
  local_648.field_2._M_allocated_capacity = 0;
  local_648.field_2._8_8_ = 0;
  local_648._M_dataplus._M_p = (pointer)0x0;
  local_648._M_string_length = 0;
  local_5f0._M_dataplus._M_p = (pointer)&local_648;
  local_5f0.field_2._8_8_ = &local_56c;
  iVar20 = (int)local_5a8;
  local_5f0._M_string_length = (size_type)&local_a8;
  local_5f0.field_2._M_allocated_capacity = (size_type)&local_128;
  std::
  vector<std::future<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::future<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  ::reserve((vector<std::future<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::future<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
             *)local_618,(long)(iVar20 + -1));
  if (1 < iVar20) {
    do {
      local_528 = (undefined1  [8])0x0;
      _Stack_520._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x70);
      p_Var13->_M_use_count = 1;
      p_Var13->_M_weak_count = 1;
      p_Var13->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0012d238;
      p_Var15 = p_Var13 + 1;
      p_Var13[2]._M_use_count = 0;
      p_Var13[1]._M_use_count = 0;
      p_Var13[1]._M_weak_count = 0;
      *(undefined8 *)((long)&p_Var13[1]._M_weak_count + 1) = 0;
      p_Var13[3]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var13[3]._M_use_count = 0;
      p_Var13[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_0012d288;
      p_Var14 = (_Result<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)operator_new(0x48);
      std::__future_base::
      _Result<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::_Result(p_Var14);
      p_Var13[4]._vptr__Sp_counted_base = (_func_int **)p_Var14;
      *(pointer *)&p_Var13[4]._M_use_count = local_5f0._M_dataplus._M_p;
      p_Var13[5]._vptr__Sp_counted_base = (_func_int **)local_5f0._M_string_length;
      p_Var13[5]._M_use_count = local_5f0.field_2._M_allocated_capacity._0_4_;
      p_Var13[5]._M_weak_count = local_5f0.field_2._M_allocated_capacity._4_4_;
      p_Var13[6]._vptr__Sp_counted_base = (_func_int **)local_5f0.field_2._8_8_;
      p_Var13[6]._M_use_count = local_5d0;
      p_Var13[6]._M_weak_count = uStack_5cc;
      local_328 = (undefined1  [8])0x0;
      local_5c8._M_dataplus._M_p = (pointer)operator_new(0x20);
      *(undefined ***)local_5c8._M_dataplus._M_p = &PTR___State_0012d2e0;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_5c8._M_dataplus._M_p + 8) =
           p_Var15;
      *(code **)((long)local_5c8._M_dataplus._M_p + 0x10) =
           std::__future_base::
           _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Toeger[P]LibFinder/generate.cpp:127:24)>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::_M_run;
      *(long *)((long)local_5c8._M_dataplus._M_p + 0x18) = 0;
      std::thread::_M_start_thread(local_328,&local_5c8,0);
      if ((long *)local_5c8._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_5c8._M_dataplus._M_p + 8))();
      }
      _Var3._M_pi = _Stack_520._M_pi;
      if (p_Var13[3]._vptr__Sp_counted_base != (_func_int **)0x0) {
        std::terminate();
      }
      p_Var13[3]._vptr__Sp_counted_base = (_func_int **)local_328;
      bVar21 = _Stack_520._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_528 = (undefined1  [8])p_Var15;
      _Stack_520._M_pi = p_Var13;
      if (bVar21) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var3._M_pi);
      }
      if (local_528 == (undefined1  [8])0x0) {
        p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x60);
        p_Var15->_M_use_count = 1;
        p_Var15->_M_weak_count = 1;
        p_Var15->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0012d320;
        p_Var15[2]._M_use_count = 0;
        p_Var15[1]._M_use_count = 0;
        p_Var15[1]._M_weak_count = 0;
        *(undefined8 *)((long)&p_Var15[1]._M_weak_count + 1) = 0;
        p_Var15[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Deferred_state_0012d370;
        p_Var14 = (_Result<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   *)operator_new(0x48);
        std::__future_base::
        _Result<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::_Result(p_Var14);
        _Var3._M_pi = _Stack_520._M_pi;
        p_Var15[3]._vptr__Sp_counted_base = (_func_int **)p_Var14;
        *(pointer *)&p_Var15[3]._M_use_count = local_5f0._M_dataplus._M_p;
        p_Var15[4]._vptr__Sp_counted_base = (_func_int **)local_5f0._M_string_length;
        p_Var15[4]._M_use_count = local_5f0.field_2._M_allocated_capacity._0_4_;
        p_Var15[4]._M_weak_count = local_5f0.field_2._M_allocated_capacity._4_4_;
        p_Var15[5]._vptr__Sp_counted_base = (_func_int **)local_5f0.field_2._8_8_;
        p_Var15[5]._M_use_count = local_5d0;
        p_Var15[5]._M_weak_count = uStack_5cc;
        bVar21 = _Stack_520._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_528 = (undefined1  [8])(p_Var15 + 1);
        _Stack_520._M_pi = p_Var15;
        if (bVar21) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var3._M_pi);
        }
      }
      std::
      __basic_future<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::__basic_future((__basic_future<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)local_5a0,(__state_type *)local_528);
      if (_Stack_520._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_520._M_pi);
      }
      std::
      vector<std::future<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>,std::allocator<std::future<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>>>
      ::
      emplace_back<std::future<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>>
                ((vector<std::future<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>,std::allocator<std::future<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>>>
                  *)local_618,
                 (future<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)local_5a0);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_598._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_598._0_8_);
      }
      uVar5 = (int)local_5a8 - 1;
      local_5a8 = (ulong)uVar5;
    } while (1 < (int)uVar5);
  }
  update(int)::$_0::operator()[abi_cxx11_((Map *)local_5a0,&local_5f0);
  uVar2 = local_618._8_8_;
  if (local_618._0_8_ != local_618._8_8_) {
    this = (future<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            *)local_618._0_8_;
    do {
      std::
      future<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::get((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_528,this);
      for (uVar16 = local_518[0]._8_8_;
          (_Rb_tree_node_base *)uVar16 != (_Rb_tree_node_base *)&_Stack_520;
          uVar16 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar16)) {
        pmVar11 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_5a0,(key_type *)(uVar16 + 0x20));
        std::__cxx11::string::_M_append((char *)pmVar11,*(ulong *)(uVar16 + 0x40));
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_528);
      this = this + 1;
    } while (this != (future<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)uVar2);
  }
  local_528[0] = 10;
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_528,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"writing results to file ",0x18);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar10,data_base_filepath_abi_cxx11_._M_dataplus._M_p,
             data_base_filepath_abi_cxx11_._M_string_length);
  std::ostream::flush();
  std::ofstream::ofstream(local_528,(string *)&data_base_filepath_abi_cxx11_,_S_out|_S_bin);
  std::ofstream::ofstream(local_328,(string *)&data_base_index_filepath_abi_cxx11_,_S_out|_S_bin);
  if ((_Rb_tree_node_base *)local_598._16_8_ != (_Rb_tree_node_base *)local_598) {
    p_Var17 = (_Rb_tree_node_base *)local_598._16_8_;
    do {
      uVar6 = std::ostream::tellp();
      local_5c8._M_dataplus._M_p._0_4_ = uVar6;
      std::ostream::write(local_328,(long)&local_5c8);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_528,*(char **)(p_Var17 + 1),(long)p_Var17[1]._M_parent);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,*(char **)(p_Var17 + 2),(long)p_Var17[2]._M_parent);
      local_649 = '\0';
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,&local_649,1);
      p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17);
    } while (p_Var17 != (_Rb_tree_node_base *)local_598);
  }
  plVar8 = (long *)std::ostream::flush();
  if ((*(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) & 5) != 0) {
    __assert_fail("index_file.flush()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Toeger[P]LibFinder/generate.cpp"
                  ,0xa9,"void update(int)");
  }
  plVar8 = (long *)std::ostream::flush();
  p_Var15 = local_560;
  uVar2 = local_568;
  if ((*(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) & 5) != 0) {
    __assert_fail("db_file.flush()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Toeger[P]LibFinder/generate.cpp"
                  ,0xaa,"void update(int)");
  }
  local_328 = (undefined1  [8])local_560;
  *(undefined8 *)(local_328 + *(long *)&local_560[-2]._M_use_count) = local_568;
  std::filebuf::~filebuf((filebuf *)&local_320);
  std::ios_base::~ios_base(aiStack_230);
  local_528 = (undefined1  [8])p_Var15;
  *(undefined8 *)(local_528 + *(long *)&p_Var15[-2]._M_use_count) = uVar2;
  std::filebuf::~filebuf((filebuf *)&_Stack_520);
  std::ios_base::~ios_base(aiStack_430);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_5a0);
  std::
  vector<std::future<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::future<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  ::~vector((vector<std::future<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::future<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
             *)local_618);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_558);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&_Stack_100);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&_Stack_80);
  return;
}

Assistant:

void update(int jobs) {
	std::cout << "Generating file list\n" << std::flush;
	Thread_safe_queue<std::string> so_file_paths;
	Thread_safe_queue<std::string> a_file_paths;
	std::map<std::string, std::string> symbolic_links;
	std::atomic<int> libs{0};
	int symbol_counter = 0;
	{
		//add all lib*.so files to queue
		auto &queue = so_file_paths.not_thread_safe_get();
		std::istringstream is(get_output_from_command(R"(locate -ber lib.*\.so$)"));
		for (std::string line; std::getline(is, line);) {
			auto file_type = get_output_from_command("file \"" + line + '"');
			if (file_type.find("ELF 64-bit LSB shared object") != std::string::npos) {
				queue.push(std::move(line));
				std::cout << ++symbol_counter << '\r' << std::flush;
			} else if (file_type.find("symbolic link")) {
				symbolic_links[get_output_from_command("readlink -f \"" + line + '"')] += file_separator + line;
			}
			//else skip
		}
	}
	{
		//add all lib*.a files to queue
		auto &queue = a_file_paths.not_thread_safe_get();
		std::istringstream is(get_output_from_command(R"(locate -ber lib.*\.a$)"));
		for (std::string line; std::getline(is, line);) {
			auto file_type = get_output_from_command("file \"" + line + '"');
			if (file_type.find("current ar archive") != std::string::npos) {
				queue.push(std::move(line));
				std::cout << ++symbol_counter << '\r' << std::flush;
			} else if (file_type.find("symbolic link")) {
				symbolic_links[get_output_from_command("readlink -f \"" + line + '"')] += file_separator + line;
			}
			//else skip
		}
	}
	{
		//create symbolic link file
		boost::filesystem::create_directory(data_base_path);
		std::ofstream symbolic_links_file(symbolic_links_filepath, std::ios_base::out | std::ios::binary);
		std::ofstream symbolic_links_index_file(symbolic_links_index_filepath, std::ios_base::out | std::ios::binary);
		for (const auto &link : symbolic_links) {
			File_index_t index = symbolic_links_file.tellp();
			symbolic_links_index_file.write(any_cast<const char *>(&index), sizeof index);
			symbolic_links_file << link.first << link.second << entry_separator;
		}
		assert(symbolic_links_file.flush());
		assert(symbolic_links_index_file.flush());
	}
	const int total_libs = so_file_paths.size() + a_file_paths.size();

	std::vector<std::future<Map>> threads;
	std::mutex printer;

	//function for each thread to execute, which takes a chunk of paths to scan from the queue and scans them until the queue is empty
	auto thread_handler = [&printer, &so_file_paths, &a_file_paths, &libs, total_libs] {
		Map symbol_map;
		while (!so_file_paths.empty()) {
			auto lib_paths = so_file_paths.pop_n(100);
			for (auto &lib_path : lib_paths) {
				auto added_symbols = add_to_database_so(symbol_map, lib_path);
				std::lock_guard<std::mutex> lock(printer);
				symbols += added_symbols;
				std::cout << "found " << symbols << " symbols in " << ++libs << "/" << total_libs << " libs\r" << std::flush;
			}
		}
		while (!a_file_paths.empty()) {
			auto lib_paths = a_file_paths.pop_n(100);
			for (auto &lib_path : lib_paths) {
				auto added_symbols = add_to_database_a(symbol_map, lib_path);
				std::lock_guard<std::mutex> lock(printer);
				symbols += added_symbols;
				std::cout << "found " << symbols << " symbols in " << ++libs << "/" << total_libs << " libs\r" << std::flush;
			}
		}
		return symbol_map;
	};
	//create threads
	threads.reserve(jobs - 1);
	std::generate_n(std::back_inserter(threads), jobs - 1, [&thread_handler] { return std::async(std::launch::async, thread_handler); });
	auto symbol_map = thread_handler();
	//collect results
	for (auto &t : threads) {
		for (auto &p : t.get()) {
			symbol_map[p.first] += p.second;
		}
	}

	//write results to disk
	std::cout << '\n' << "writing results to file " << data_base_filepath << std::flush;
	std::ofstream db_file(data_base_filepath, std::ios_base::out | std::ios::binary);
	std::ofstream index_file(data_base_index_filepath, std::ios_base::out | std::ios::binary);
	for (auto &p : symbol_map) {
		File_index_t index = db_file.tellp();
		index_file.write(any_cast<const char *>(&index), sizeof index);
		db_file << p.first << p.second << entry_separator;
	}
	assert(index_file.flush());
	assert(db_file.flush());
}